

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<ProKey,QMakeInternal::QMakeBuiltin>::emplace<QMakeInternal::QMakeBuiltin_const&>
          (QHash<ProKey,_QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  long lVar1;
  bool bVar2;
  ProKey *in_RSI;
  QHash<ProKey,_QMakeInternal::QMakeBuiltin> *in_RDI;
  long in_FS_OFFSET;
  QHash<ProKey,_QMakeInternal::QMakeBuiltin> copy;
  QMakeBuiltin *in_stack_ffffffffffffff78;
  QMakeBuiltin *in_stack_ffffffffffffff80;
  QMakeBuiltin *in_stack_ffffffffffffff88;
  ProKey *in_stack_ffffffffffffff90;
  piter local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::isDetached
                    ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::shouldGrow
                      (in_RDI->d);
    if (bVar2) {
      QMakeInternal::QMakeBuiltin::QMakeBuiltin(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
      ;
      local_48 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::
                        emplace_helper<QMakeInternal::QMakeBuiltin>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff88);
      QMakeInternal::QMakeBuiltin::~QMakeBuiltin((QMakeBuiltin *)0x2dd084);
    }
    else {
      local_48 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>
                                  (in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  else {
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::QHash
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff80,
               (QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff78);
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::detach
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff80);
    local_48 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>
                                (in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::~QHash
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_48;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }